

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choker.cpp
# Opt level: O2

int libtorrent::aux::anon_unknown_9::anti_leech_score(peer_connection *peer)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  shared_ptr<libtorrent::aux::torrent> t;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&local_28,
             &(peer->super_peer_connection_hot_members).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,&local_28);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28._M_refcount);
  lVar3 = ((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_total_size;
  if (lVar3 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (*(peer->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])(peer);
    lVar2 = lVar3 / 2;
    lVar4 = *(long *)CONCAT44(extraout_var,iVar1);
    if (lVar2 < *(long *)CONCAT44(extraout_var,iVar1)) {
      lVar4 = lVar2;
    }
    lVar5 = (long)peer->m_num_pieces *
            (long)((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_files).m_piece_length;
    if (lVar5 < lVar4) {
      lVar5 = lVar4;
    }
    lVar3 = ((lVar5 - lVar2) * 2000) / lVar3;
    lVar4 = -lVar3;
    if (0 < lVar3) {
      lVar4 = lVar3;
    }
    iVar1 = (int)lVar4;
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return iVar1;
}

Assistant:

int anti_leech_score(peer_connection const* peer)
	{
		// the anti-leech seeding algorithm is based on the paper "Improving
		// BitTorrent: A Simple Approach" from Chow et. al. and ranks peers based
		// on how many pieces they have, preferring to unchoke peers that just
		// started and peers that are close to completing. Like this:
		//   ^
		//   | \                       / |
		//   |  \                     /  |
		//   |   \                   /   |
		// s |    \                 /    |
		// c |     \               /     |
		// o |      \             /      |
		// r |       \           /       |
		// e |        \         /        |
		//   |         \       /         |
		//   |          \     /          |
		//   |           \   /           |
		//   |            \ /            |
		//   |             V             |
		//   +---------------------------+
		//   0%    num have pieces     100%
		std::shared_ptr<torrent> const t = peer->associated_torrent().lock();
		TORRENT_ASSERT(t);

		std::int64_t const total_size = t->torrent_file().total_size();
		if (total_size == 0) return 0;
		// Cap the given_size so that it never causes the score to increase
		std::int64_t const given_size = std::min(peer->statistics().total_payload_upload()
			, total_size / 2);
		std::int64_t const have_size = std::max(given_size
			, std::int64_t(t->torrent_file().piece_length()) * peer->num_have_pieces());
		return int(std::abs((have_size - total_size / 2) * 2000 / total_size));
	}